

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<const_kj::ReadableFile,_std::nullptr_t> __thiscall
kj::ReadableDirectory::openFile(ReadableDirectory *this,PathPtr path)

{
  Own<const_kj::ReadableFile,_std::nullptr_t> *pOVar1;
  Clock *clock;
  undefined8 in_RCX;
  ReadableFile *extraout_RDX;
  Own<const_kj::ReadableFile,_std::nullptr_t> OVar2;
  undefined1 local_90 [24];
  Fault f;
  Own<const_kj::ReadableFile,_std::nullptr_t> *file;
  undefined1 local_38 [8];
  OwnOwn<const_kj::ReadableFile,_std::nullptr_t> _file552;
  ReadableDirectory *this_local;
  PathPtr path_local;
  
  this_local = (ReadableDirectory *)path.parts.size_;
  _file552.value.ptr = (ReadableFile *)path.parts.ptr;
  path_local.parts.size_ = (size_t)this;
  (**(code **)((((String *)_file552.value.ptr)->content).ptr + 0x50))
            ((Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> *)&stack0xffffffffffffffb8,
             _file552.value.ptr,this_local,in_RCX);
  kj::_::readMaybe<kj::ReadableFile_const,decltype(nullptr)>
            ((_ *)local_38,
             (Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> *)&stack0xffffffffffffffb8);
  Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>::~Maybe
            ((Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> *)&stack0xffffffffffffffb8);
  pOVar1 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_38);
  if (pOVar1 == (Own<const_kj::ReadableFile,_std::nullptr_t> *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::PathPtr&>
              ((Fault *)(local_90 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x22b,FAILED,(char *)0x0,"\"no such file\", path",(char (*) [13])"no such file",
               (PathPtr *)&this_local);
    f.exception._4_4_ = 2;
    kj::_::Debug::Fault::~Fault((Fault *)(local_90 + 0x10));
    clock = nullClock();
    newInMemoryFile((kj *)local_90,clock);
    Own<kj::ReadableFile_const,decltype(nullptr)>::Own<kj::File,void>
              ((Own<kj::ReadableFile_const,decltype(nullptr)> *)this,
               (Own<kj::File,_std::nullptr_t> *)local_90);
    Own<kj::File,_std::nullptr_t>::~Own((Own<kj::File,_std::nullptr_t> *)local_90);
  }
  else {
    pOVar1 = kj::_::OwnOwn<const_kj::ReadableFile,_std::nullptr_t>::operator*
                       ((OwnOwn<const_kj::ReadableFile,_std::nullptr_t> *)local_38);
    pOVar1 = mv<kj::Own<kj::ReadableFile_const,decltype(nullptr)>>(pOVar1);
    Own<const_kj::ReadableFile,_std::nullptr_t>::Own
              ((Own<const_kj::ReadableFile,_std::nullptr_t> *)this,pOVar1);
  }
  f.exception._4_4_ = 1;
  kj::_::OwnOwn<const_kj::ReadableFile,_std::nullptr_t>::~OwnOwn
            ((OwnOwn<const_kj::ReadableFile,_std::nullptr_t> *)local_38);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<const ReadableFile> ReadableDirectory::openFile(PathPtr path) const {
  KJ_IF_SOME(file, tryOpenFile(path)) {
    return kj::mv(file);
  } else {
    KJ_FAIL_REQUIRE("no such file", path) { break; }